

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void QSslSocketPrivate::addDefaultCaCertificate(QSslCertificate *cert)

{
  long lVar1;
  bool bVar2;
  QMutexLocker<QMutex> *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
  *in_stack_ffffffffffffffc8;
  QMutexLocker<QMutex> *this;
  QMutexLocker<QMutex> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ensureInitialized();
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
            (in_stack_ffffffffffffffc8);
  QMutexLocker<QMutex>::QMutexLocker(in_stack_ffffffffffffffd0,(QMutex *)in_stack_ffffffffffffffc8);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
            (in_stack_ffffffffffffffc8);
  QExplicitlySharedDataPointer<QSslConfigurationPrivate>::operator->
            ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)0x3a5d29);
  bVar2 = QListSpecialMethodsBase<QSslCertificate>::contains<QSslCertificate>
                    ((QListSpecialMethodsBase<QSslCertificate> *)in_stack_ffffffffffffffd0,
                     (QSslCertificate *)in_stack_ffffffffffffffc8);
  if (!bVar2) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
              (in_stack_ffffffffffffffc8);
    QExplicitlySharedDataPointer<QSslConfigurationPrivate>::detach
              ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)in_stack_ffffffffffffffd0);
    this = in_RDI;
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
              ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
               in_RDI);
    QExplicitlySharedDataPointer<QSslConfigurationPrivate>::operator->
              ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)0x3a5d86);
    QList<QSslCertificate>::operator+=
              ((QList<QSslCertificate> *)in_stack_ffffffffffffffd0,(parameter_type)this);
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
              ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
               this);
    QExplicitlySharedDataPointer<QSslConfigurationPrivate>::detach
              ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)in_stack_ffffffffffffffd0);
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
              ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
               this);
    QExplicitlySharedDataPointer<QSslConfigurationPrivate>::operator->
              ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)0x3a5dd0);
    QList<QSslCertificate>::operator+=((QList<QSslCertificate> *)in_RDI,(parameter_type)this);
    in_stack_ffffffffffffffd0 = in_RDI;
  }
  QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffffd0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslSocketPrivate::addDefaultCaCertificate(const QSslCertificate &cert)
{
    QSslSocketPrivate::ensureInitialized();
    QMutexLocker locker(&globalData()->mutex);
    if (globalData()->config->caCertificates.contains(cert))
        return;
    globalData()->config.detach();
    globalData()->config->caCertificates += cert;
    globalData()->dtlsConfig.detach();
    globalData()->dtlsConfig->caCertificates += cert;
}